

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

int Kf_ManComputeDelay(Kf_Man_t *p,int fEval)

{
  int iVar1;
  int *pCut;
  Gia_Obj_t *pObj_00;
  bool bVar2;
  int local_28;
  int local_24;
  int Delay;
  int i;
  Gia_Obj_t *pObj;
  int fEval_local;
  Kf_Man_t *p_local;
  
  local_28 = 0;
  if (fEval != 0) {
    local_24 = 0;
    while( true ) {
      bVar2 = false;
      if (local_24 < p->pGia->nObjs) {
        _Delay = Gia_ManObj(p->pGia,local_24);
        bVar2 = _Delay != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Gia_ObjIsAnd(_Delay);
      if ((iVar1 != 0) && (iVar1 = Gia_ObjRefNum(p->pGia,_Delay), 0 < iVar1)) {
        pCut = Kf_ObjCutBest(p,local_24);
        iVar1 = Kf_CutTime(p,pCut);
        Vec_IntWriteEntry(&p->vTime,local_24,iVar1);
      }
      local_24 = local_24 + 1;
    }
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->pGia->vCos);
    bVar2 = false;
    if (local_24 < iVar1) {
      pObj_00 = Gia_ManCo(p->pGia,local_24);
      _Delay = Gia_ObjFanin0(pObj_00);
      bVar2 = _Delay != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjRefNum(p->pGia,_Delay);
    if (iVar1 < 1) {
      __assert_fail("Gia_ObjRefNum(p->pGia, pObj) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                    ,0x385,"int Kf_ManComputeDelay(Kf_Man_t *, int)");
    }
    iVar1 = Gia_ObjId(p->pGia,_Delay);
    iVar1 = Kf_ObjTime(p,iVar1);
    local_28 = Abc_MaxInt(local_28,iVar1);
    local_24 = local_24 + 1;
  }
  return local_28;
}

Assistant:

int Kf_ManComputeDelay( Kf_Man_t * p, int fEval )
{
    Gia_Obj_t * pObj; 
    int i, Delay = 0;
    if ( fEval )
    {
        Gia_ManForEachAnd( p->pGia, pObj, i )
            if ( Gia_ObjRefNum(p->pGia, pObj) > 0 )
                Vec_IntWriteEntry( &p->vTime, i, Kf_CutTime(p, Kf_ObjCutBest(p, i)) );
    }
    Gia_ManForEachCoDriver( p->pGia, pObj, i )
    {
        assert( Gia_ObjRefNum(p->pGia, pObj) > 0 );
        Delay = Abc_MaxInt( Delay, Kf_ObjTime(p, Gia_ObjId(p->pGia, pObj)) );
    }
    return Delay;
}